

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# address.hh
# Opt level: O1

bool __thiscall std::less<Address>::operator()(less<Address> *this,Address *__x,Address *__y)

{
  AddrSpace *pAVar1;
  AddrSpace *pAVar2;
  bool bVar3;
  
  pAVar1 = __x->base;
  pAVar2 = __y->base;
  if (pAVar1 == pAVar2) {
    return __x->offset < __y->offset;
  }
  bVar3 = true;
  if (pAVar1 != (AddrSpace *)0x0) {
    if ((pAVar1 == (AddrSpace *)0xffffffffffffffff) || (pAVar2 == (AddrSpace *)0x0)) {
      return false;
    }
    if (pAVar2 != (AddrSpace *)0xffffffffffffffff) {
      bVar3 = pAVar1->index < pAVar2->index;
    }
  }
  return bVar3;
}

Assistant:

inline bool Address::operator<(const Address &op2) const {
  if (base != op2.base)  {
    if (base == (AddrSpace *)0) {
      return true;
    }
    else if (base == (AddrSpace *) ~((uintp)0)) {
      return false;
    }
    else if (op2.base == (AddrSpace *)0) {
      return false;
    }
    else if (op2.base == (AddrSpace *) ~((uintp)0)) {
      return true;
    }
    return (base->getIndex() < op2.base->getIndex());
  }
  if (offset != op2.offset) return (offset < op2.offset);
  return false;
}